

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlRpcValue.h
# Opt level: O1

XmlRpcValue * __thiscall XmlRpc::XmlRpcValue::operator[](XmlRpcValue *this,int i)

{
  pointer pcVar1;
  
  assertArray(this,i + 1);
  pcVar1 = (((this->_value).asBinary)->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)(long)i <
      (ulong)((long)(((this->_value).asBinary)->super__Vector_base<char,_std::allocator<char>_>).
                    _M_impl.super__Vector_impl_data._M_finish - (long)pcVar1 >> 4)) {
    return (XmlRpcValue *)(pcVar1 + (long)i * 0x10);
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
}

Assistant:

XmlRpcValue& operator[](int i)             { assertArray(i+1); return _value.asArray->at(i); }